

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cc
# Opt level: O1

void __thiscall xemmai::t_engine::f_collector(t_engine *this)

{
  t_heap<xemmai::t_object> *this_00;
  t_object *ptVar1;
  t_internal *this_01;
  t_object *ptVar2;
  t_handle *ptVar3;
  int iVar4;
  ulong uVar5;
  t_object *ptVar6;
  size_t sVar7;
  t_object *ptVar8;
  t_object *p;
  t_object *ptVar9;
  lock_guard<std::mutex> lock;
  bool bVar10;
  t_handle *q;
  t_internal *ptVar11;
  t_object *ptVar12;
  long *in_FS_OFFSET;
  bool bVar13;
  anon_class_16_2_20c11228_for___vfn __vfn;
  
  in_FS_OFFSET[-0xc] = (long)this;
  if ((this->v_options).v_verbose == true) {
    f_collector();
  }
  ptVar1 = (t_object *)(*in_FS_OFFSET + -0x20);
  in_FS_OFFSET[-3] = (long)ptVar1;
  in_FS_OFFSET[-4] = (long)ptVar1;
  uVar5 = (ulong)(((uint)this & 0x38) << 5);
  this_00 = &this->v_object__heap;
  while( true ) {
    (this->v_collector__running).super___atomic_flag_base._M_i = false;
    LOCK();
    *(int *)(std::__detail::__waiter_pool_base::_S_for(void_const*)::__w + uVar5 + 0x40) =
         *(int *)(std::__detail::__waiter_pool_base::_S_for(void_const*)::__w + uVar5 + 0x40) + 1;
    UNLOCK();
    if (*(int *)(std::__detail::__waiter_pool_base::_S_for(void_const*)::__w + uVar5) != 0) {
      syscall(0xca,uVar5 + 0x19e3c0,1,0x7fffffff);
    }
    __vfn.this = &this->v_collector__running;
    __vfn._0_8_ = 2;
    std::
    __atomic_wait_address_v<bool,std::atomic_flag::wait(bool,std::memory_order)const::_lambda()_1_>
              ((bool *)this,false,__vfn);
    if (this->v_collector__quitting != false) {
      if ((this->v_options).v_verbose == true) {
        f_collector();
      }
      (this->v_collector__running).super___atomic_flag_base._M_i = false;
      LOCK();
      *(int *)(std::__detail::__waiter_pool_base::_S_for(void_const*)::__w + uVar5 + 0x40) =
           *(int *)(std::__detail::__waiter_pool_base::_S_for(void_const*)::__w + uVar5 + 0x40) + 1;
      UNLOCK();
      if (*(int *)(std::__detail::__waiter_pool_base::_S_for(void_const*)::__w + uVar5) != 0) {
        syscall(0xca,uVar5 + 0x19e3c0,1,0x7fffffff);
        return;
      }
      return;
    }
    this->v_collector__epoch = this->v_collector__epoch + 1;
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->v_thread__mutex);
    this_01 = (t_internal *)&this->v_thread__internals;
    if (iVar4 != 0) break;
    while (ptVar11 = this_01, this_01 = ptVar11->v_next, this_01 != (t_internal *)0x0) {
      if (-1 < this_01->v_done) {
        t_thread::t_internal::f_epoch(this_01);
      }
      if (2 < this_01->v_done) {
        ptVar11->v_next = this_01->v_next;
        operator_delete(this_01,0xca0);
        this_01 = ptVar11;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->v_thread__mutex);
    if (this->v_cycles == (t_object *)0x0) {
      ptVar9 = (t_object *)0x0;
    }
    else {
      ptVar9 = (t_object *)0x0;
      do {
        iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->v_object__reviving__mutex);
        if (iVar4 != 0) goto LAB_00176657;
        ptVar6 = this->v_cycles;
        this->v_cycles = ptVar6->v_next_cycle;
        bVar10 = false;
        ptVar12 = ptVar6;
        do {
          ptVar8 = ptVar6->v_next;
          if (ptVar8->v_type == (t_type *)0x0) {
            ptVar6->v_next = ptVar8->v_next;
            this->v_object__collect = this->v_object__collect + 1;
            ptVar8->v_count = 1;
            t_heap<xemmai::t_object>::f_free(this_00,ptVar8);
            bVar13 = true;
            if (ptVar8 == ptVar12) {
              bVar13 = false;
              ptVar12 = (t_object *)0x0;
              if (ptVar6 != ptVar8) {
                ptVar12 = ptVar6;
              }
            }
          }
          else {
            if (((ptVar8->v_color != c_color__ORANGE) || (ptVar8->v_cyclic != 0)) ||
               (ptVar8->v_reviving == true)) {
              bVar10 = true;
            }
            ptVar8->v_reviving = false;
            bVar13 = ptVar8 != ptVar12;
            ptVar6 = ptVar8;
          }
        } while (bVar13);
        if (ptVar12 != (t_object *)0x0) {
          if (bVar10) {
            if (ptVar12->v_color == c_color__ORANGE) {
              ptVar12->v_color = c_color__PURPLE;
            }
            ptVar6 = (t_object *)in_FS_OFFSET[-3];
            ptVar8 = ptVar12;
            do {
              ptVar2 = ptVar8->v_next;
              if (ptVar8->v_count == 0) {
                ptVar8->v_next = ptVar9;
                ptVar9 = ptVar8;
              }
              else if (ptVar8->v_color == c_color__PURPLE) {
                ptVar8->v_next = ptVar1;
                ptVar8->v_previous = ptVar6;
                in_FS_OFFSET[-3] = (long)ptVar8;
                ptVar6->v_next = ptVar8;
                ptVar6 = ptVar8;
              }
              else {
                ptVar8->v_color = c_color__BLACK;
                ptVar8->v_next = (t_object *)0x0;
              }
              ptVar8 = ptVar2;
            } while (ptVar2 != ptVar12);
          }
          else {
            do {
              ptVar6->v_color = c_color__RED;
              ptVar6 = ptVar6->v_next;
            } while (ptVar6 != ptVar12);
            do {
              t_object::f_cyclic_decrement(ptVar6);
              ptVar6 = ptVar6->v_next;
            } while (ptVar6 != ptVar12);
            do {
              ptVar8 = ptVar6->v_next;
              this->v_object__collect = this->v_object__collect + 1;
              ptVar6->v_count = 1;
              t_heap<xemmai::t_object>::f_free(this_00,ptVar6);
              ptVar6 = ptVar8;
            } while (ptVar8 != ptVar12);
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)&this->v_object__reviving__mutex);
      } while (this->v_cycles != (t_object *)0x0);
    }
    while (ptVar9 != (t_object *)0x0) {
      ptVar6 = ptVar9->v_next;
      ptVar9->v_next = (t_object *)0x0;
      t_object::f_loop<&xemmai::t_object::f_decrement_step>(ptVar9);
      ptVar9 = ptVar6;
    }
    ptVar3 = this->v_library__handle__finalizing;
    while (ptVar3 != (t_handle *)0x0) {
      this->v_library__handle__finalizing = ptVar3->v_next;
      if ((ptVar3->v_library).v_handle != (void *)0x0) {
        dlclose();
      }
      operator_delete(ptVar3,0x10);
      ptVar3 = this->v_library__handle__finalizing;
    }
    if ((t_object *)in_FS_OFFSET[-4] != ptVar1) {
      sVar7 = t_heap<xemmai::t_object>::f_live(this_00);
      if (sVar7 < this->v_object__lower) {
        this->v_object__lower = sVar7;
      }
      if ((this->v_options).v_collector__threshold <= sVar7 - this->v_object__lower) {
        this->v_object__lower = sVar7;
        this->v_collector__collect = this->v_collector__collect + 1;
        ptVar9 = (t_object *)in_FS_OFFSET[-4];
        ptVar6 = ptVar1;
        do {
          if (ptVar9->v_count == 0) {
            __assert_fail("q->v_count > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/src/engine.cc"
                          ,0x69,"void xemmai::t_engine::f_collector()");
          }
          if (ptVar9->v_color == c_color__PURPLE) {
            ptVar9->v_color = c_color__GRAY;
            ptVar9->v_cyclic = ptVar9->v_count;
            t_object::
            f_loop<&(void_xemmai::t_object::f_step<&xemmai::t_object::f_mark_gray_push>())>(ptVar9);
            ptVar6 = ptVar9;
          }
          else {
            ptVar6->v_next = ptVar9->v_next;
            ptVar9->v_next = (t_object *)0x0;
          }
          ptVar9 = ptVar6->v_next;
        } while (ptVar9 != ptVar1);
        ptVar9 = (t_object *)in_FS_OFFSET[-4];
        if (ptVar9 != ptVar1) {
          do {
            t_object::f_scan_gray(ptVar9);
            ptVar9 = ptVar9->v_next;
          } while (ptVar9 != ptVar1);
          do {
            ptVar9 = (t_object *)in_FS_OFFSET[-4];
            in_FS_OFFSET[-4] = (long)ptVar9->v_next;
            if (ptVar9->v_color == c_color__WHITE) {
              ptVar9->v_color = c_color__RED;
              ptVar9->v_cyclic = ptVar9->v_count;
              ptVar9->v_next = ptVar9;
              in_FS_OFFSET[-1] = (long)ptVar9;
              ptVar9->v_previous = (t_object *)0x0;
              t_object::
              f_loop<&(void_xemmai::t_object::f_step<&xemmai::t_object::f_collect_white_push>())>
                        (ptVar9);
              ptVar9 = (t_object *)in_FS_OFFSET[-1];
              ptVar6 = ptVar9;
              do {
                t_object::f_step<&xemmai::t_object::f_scan_red>(ptVar6);
                ptVar6 = ptVar6->v_next;
              } while (ptVar6 != ptVar9);
              do {
                ptVar6->v_color = c_color__ORANGE;
                ptVar6 = ptVar6->v_next;
              } while (ptVar6 != ptVar9);
              ptVar9->v_next_cycle = this->v_cycles;
              this->v_cycles = ptVar9;
            }
            else {
              ptVar9->v_next = (t_object *)0x0;
            }
          } while ((t_object *)in_FS_OFFSET[-4] != ptVar1);
        }
        in_FS_OFFSET[-3] = (long)ptVar1;
      }
    }
    t_heap<xemmai::t_object>::f_flush(this_00);
  }
LAB_00176657:
  std::__throw_system_error(iVar4);
}

Assistant:

void t_engine::f_collector()
{
	v_instance = this;
	if (v_options.v_verbose) std::fprintf(stderr, "collector starting...\n");
	t_object::v_roots.v_next = t_object::v_roots.v_previous = reinterpret_cast<t_object*>(&t_object::v_roots);
	while (true) {
		v_collector__running.clear(std::memory_order_relaxed);
		v_collector__running.notify_all();
		v_collector__running.wait(false, std::memory_order_acquire);
		if (v_collector__quitting) break;
		++v_collector__epoch;
		{
			std::lock_guard lock(v_thread__mutex);
			for (auto p = &v_thread__internals; *p;) {
				auto q = *p;
				if (q->v_done >= 0) q->f_epoch();
				if (q->v_done < 3) {
					p = &q->v_next;
				} else {
					*p = q->v_next;
					delete q;
				}
			}
		}
		t_object* garbage = nullptr;
		while (v_cycles) {
			std::lock_guard lock(v_object__reviving__mutex);
			auto cycle = v_cycles;
			v_cycles = cycle->v_next_cycle;
			auto failed = false;
			auto p = cycle;
			while (true) {
				auto q = p->v_next;
				if (q->v_type) {
					if (q->v_color != c_color__ORANGE || q->v_cyclic > 0 || q->v_reviving) failed = true;
					q->v_reviving = false;
					p = q;
					if (p == cycle) break;
				} else {
					p->v_next = q->v_next;
					f_free_as_collect(q);
					if (q == cycle) {
						cycle = p == q ? nullptr : p;
						break;
					}
				}
			}
			if (!cycle) continue;
			if (failed) {
				p = cycle;
				if (p->v_color == c_color__ORANGE) p->v_color = c_color__PURPLE;
				do {
					auto q = p->v_next;
					if (p->v_count <= 0) {
						p->v_next = garbage;
						garbage = p;
					} else if (p->v_color == c_color__PURPLE) {
						t_object::f_append(p);
					} else {
						p->v_color = c_color__BLACK;
						p->v_next = nullptr;
					}
					p = q;
				} while (p != cycle);
			} else {
				do p->v_color = c_color__RED; while ((p = p->v_next) != cycle);
				do p->f_cyclic_decrement(); while ((p = p->v_next) != cycle);
				do {
					auto q = p->v_next;
					f_free_as_collect(p);
					p = q;
				} while (p != cycle);
			}
		}
		while (garbage) {
			auto p = garbage;
			garbage = p->v_next;
			p->v_next = nullptr;
			p->f_loop<&t_object::f_decrement_step>();
		}
		for (auto& p = v_library__handle__finalizing; p;) {
			auto q = p;
			p = q->v_next;
			delete q;
		}
		auto roots = reinterpret_cast<t_object*>(&t_object::v_roots);
		if (roots->v_next != roots) {
			auto live = v_object__heap.f_live();
			if (live < v_object__lower) v_object__lower = live;
			if (live - v_object__lower >= v_options.v_collector__threshold) {
				v_object__lower = live;
				++v_collector__collect;
				{
					auto p = roots;
					auto q = p->v_next;
					do {
						assert(q->v_count > 0);
						if (q->v_color == c_color__PURPLE) {
							q->f_mark_gray();
							p = q;
						} else {
							p->v_next = q->v_next;
							q->v_next = nullptr;
						}
						q = p->v_next;
					} while (q != roots);
				}
				if (roots->v_next != roots) {
					{
						auto p = roots->v_next;
						do p->f_scan_gray(); while ((p = p->v_next) != roots);
					}
					do {
						auto p = roots->v_next;
						roots->v_next = p->v_next;
						if (p->v_color == c_color__WHITE) {
							p->f_collect_white();
							auto cycle = t_object::v_cycle;
							auto q = cycle;
							do q->f_step<&t_object::f_scan_red>(); while ((q = q->v_next) != cycle);
							do q->v_color = c_color__ORANGE; while ((q = q->v_next) != cycle);
							cycle->v_next_cycle = v_cycles;
							v_cycles = cycle;
						} else {
							p->v_next = nullptr;
						}
					} while (roots->v_next != roots);
				}
				roots->v_previous = roots;
			}
		}
		v_object__heap.f_flush();
	}
	if (v_options.v_verbose) std::fprintf(stderr, "collector quitting...\n");
	v_collector__running.clear(std::memory_order_relaxed);
	v_collector__running.notify_one();
}